

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::EnableLanguage
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lang,bool optional)

{
  int iVar1;
  cmGlobalGenerator *pcVar2;
  undefined4 extraout_var;
  allocator local_41;
  string local_40;
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lang_local;
  cmMakefile *this_local;
  
  local_19 = optional;
  pvStack_18 = lang;
  lang_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_CFG_INTDIR",&local_41);
  pcVar2 = GetGlobalGenerator(this);
  iVar1 = (*pcVar2->_vptr_cmGlobalGenerator[0xd])();
  AddDefinition(this,&local_40,(char *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar2 = GetGlobalGenerator(this);
  (*pcVar2->_vptr_cmGlobalGenerator[0xb])(pcVar2,pvStack_18,this,(ulong)(local_19 & 1));
  return;
}

Assistant:

void cmMakefile::EnableLanguage(std::vector<std::string> const &  lang,
                               bool optional)
{
  this->AddDefinition("CMAKE_CFG_INTDIR",
                      this->GetGlobalGenerator()->GetCMakeCFGIntDir());
  this->GetGlobalGenerator()->EnableLanguage(lang, this, optional);
}